

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O0

void __thiscall
leveldb::EnvPosixTest_TestCloseOnExecWritableFile_Test::TestBody
          (EnvPosixTest_TestCloseOnExecWritableFile_Test *this)

{
  Env *pEVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_168;
  Message local_160;
  Status local_158;
  char local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  Status local_128;
  char local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  WritableFile *file;
  Message local_f8;
  Slice local_f0;
  Status local_e0;
  char local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  string file_path;
  AssertHelper local_98;
  Message local_90;
  Status local_88;
  char local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  string test_dir;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> open_fds;
  EnvPosixTest_TestCloseOnExecWritableFile_Test *this_local;
  
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             ((long)&test_dir.field_2 + 8));
  anon_unknown.dwarf_b8ea::GetOpenFileDescriptors
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             ((long)&test_dir.field_2 + 8));
  std::__cxx11::string::string((string *)&gtest_ar.message_);
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  pEVar1 = (this->super_EnvPosixTest).env_;
  (*pEVar1->_vptr_Env[0x13])(&local_88,pEVar1,&gtest_ar.message_);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_78,&local_79,
             (Status *)"env_->GetTestDirectory(&test_dir)");
  Status::~Status(&local_88);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar2) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
               ,0x10b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar_1.message_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar.message_,"/close_on_exec_writable.txt");
    test::IsOK();
    testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
    pEVar1 = (this->super_EnvPosixTest).env_;
    Slice::Slice(&local_f0,"0123456789");
    WriteStringToFile((leveldb *)&local_e0,pEVar1,&local_f0,(string *)&gtest_ar_1.message_);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_d0,&local_d1,
               (Status *)"WriteStringToFile(env_, \"0123456789\", file_path)");
    Status::~Status(&local_e0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar2) {
      testing::Message::Message(&local_f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&file,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                 ,0x10d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&file,&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&file);
      testing::Message::~Message(&local_f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    if (bVar2) {
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      test::IsOK();
      testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
      pEVar1 = (this->super_EnvPosixTest).env_;
      (*pEVar1->_vptr_Env[4])(&local_128,pEVar1,&gtest_ar_1.message_,&gtest_ar_2.message_);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_118,&local_119,
                 (Status *)"env_->NewWritableFile(file_path, &file)");
      Status::~Status(&local_128);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar2) {
        testing::Message::Message(&local_130);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                   ,0x110,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_130);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_130);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      if (bVar2) {
        anon_unknown.dwarf_b8ea::CheckCloseOnExecDoesNotLeakFDs
                  ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   ((long)&test_dir.field_2 + 8));
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        test::IsOK();
        testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
        pEVar1 = (this->super_EnvPosixTest).env_;
        (*pEVar1->_vptr_Env[8])(&local_158,pEVar1,&gtest_ar_1.message_);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_148,&local_149
                   ,(Status *)"env_->RemoveFile(file_path)");
        Status::~Status(&local_158);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
        if (!bVar2) {
          testing::Message::Message(&local_160);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                     ,0x114,pcVar3);
          testing::internal::AssertHelper::operator=(&local_168,&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          testing::Message::~Message(&local_160);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      }
    }
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  }
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             ((long)&test_dir.field_2 + 8));
  return;
}

Assistant:

TEST_F(EnvPosixTest, TestCloseOnExecWritableFile) {
  std::unordered_set<int> open_fds;
  GetOpenFileDescriptors(&open_fds);

  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));
  std::string file_path = test_dir + "/close_on_exec_writable.txt";
  ASSERT_LEVELDB_OK(WriteStringToFile(env_, "0123456789", file_path));

  leveldb::WritableFile* file = nullptr;
  ASSERT_LEVELDB_OK(env_->NewWritableFile(file_path, &file));
  CheckCloseOnExecDoesNotLeakFDs(open_fds);
  delete file;

  ASSERT_LEVELDB_OK(env_->RemoveFile(file_path));
}